

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpa.c
# Opt level: O2

void hpa_dalloc_batch(tsdn_t *tsdn,pai_t *self,edata_list_active_t *list,
                     _Bool *deferred_work_generated)

{
  byte *pbVar1;
  edata_t *peVar2;
  void *addr;
  ulong uVar3;
  _Bool _Var4;
  hpdata_t *ps;
  hpa_shard_t *phVar5;
  edata_t *peVar6;
  
  peVar6 = (list->head).qlh_first;
  while (peVar6 != (edata_t *)0x0) {
    *(ushort *)&peVar6->e_addr = *(ushort *)&peVar6->e_addr & 0xf000;
    pbVar1 = (byte *)((long)&peVar6->e_bits + 1);
    *pbVar1 = *pbVar1 & 0x7f;
    duckdb_je_emap_deregister_boundary(tsdn,(emap_t *)self[100].expand,peVar6);
    peVar6 = (peVar6->field_5).ql_link_active.qre_next;
    if (peVar6 == (list->head).qlh_first) {
      peVar6 = (edata_t *)0x0;
    }
  }
  malloc_mutex_lock(tsdn,(malloc_mutex_t *)&self[1].alloc_batch);
  while (peVar6 = (list->head).qlh_first, peVar6 != (edata_t *)0x0) {
    peVar2 = (peVar6->field_5).ql_link_active.qre_next;
    (list->head).qlh_first = peVar2;
    if (peVar2 == peVar6) {
      (list->head).qlh_first = (edata_t *)0x0;
    }
    else {
      (((peVar6->field_5).ql_link_active.qre_prev)->field_5).ql_link_active.qre_next =
           (peVar2->field_5).ql_link_active.qre_prev;
      peVar2 = (peVar6->field_5).ql_link_active.qre_prev;
      (((peVar6->field_5).ql_link_active.qre_next)->field_5).ql_link_active.qre_prev = peVar2;
      (peVar6->field_5).ql_link_active.qre_prev = (peVar2->field_5).ql_link_active.qre_next;
      peVar2 = (peVar6->field_5).ql_link_active.qre_next;
      (((peVar2->field_5).ql_link_active.qre_prev)->field_5).ql_link_active.qre_next = peVar2;
      (((peVar6->field_5).ql_link_active.qre_prev)->field_5).ql_link_active.qre_next = peVar6;
    }
    addr = peVar6->e_addr;
    phVar5 = (hpa_shard_t *)peVar6->e_ps;
    uVar3 = (peVar6->field_2).e_size_esn;
    duckdb_je_edata_cache_fast_put(tsdn,(edata_cache_fast_t *)&self[5].expand,peVar6);
    duckdb_je_psset_update_begin((psset_t *)&self[5].dalloc_batch,(hpdata_t *)phVar5);
    duckdb_je_hpdata_unreserve((hpdata_t *)phVar5,addr,uVar3 & 0xfffffffffffff000);
    hpa_update_purge_hugify_eligibility((tsdn_t *)self,phVar5,ps);
    duckdb_je_psset_update_end((psset_t *)&self[5].dalloc_batch,(hpdata_t *)phVar5);
  }
  phVar5 = (hpa_shard_t *)self;
  hpa_shard_maybe_do_deferred_work(tsdn,(hpa_shard_t *)self,false);
  _Var4 = hpa_shard_has_deferred_work((tsdn_t *)self,phVar5);
  *deferred_work_generated = _Var4;
  *(undefined1 *)&self[2].expand = 0;
  pthread_mutex_unlock((pthread_mutex_t *)&self[2].shrink);
  return;
}

Assistant:

static void
hpa_dalloc_batch(tsdn_t *tsdn, pai_t *self, edata_list_active_t *list,
    bool *deferred_work_generated) {
	hpa_shard_t *shard = hpa_from_pai(self);

	edata_t *edata;
	ql_foreach(edata, &list->head, ql_link_active) {
		hpa_dalloc_prepare_unlocked(tsdn, shard, edata);
	}

	malloc_mutex_lock(tsdn, &shard->mtx);
	/* Now, remove from the list. */
	while ((edata = edata_list_active_first(list)) != NULL) {
		edata_list_active_remove(list, edata);
		hpa_dalloc_locked(tsdn, shard, edata);
	}
	hpa_shard_maybe_do_deferred_work(tsdn, shard, /* forced */ false);
	*deferred_work_generated =
	    hpa_shard_has_deferred_work(tsdn, shard);

	malloc_mutex_unlock(tsdn, &shard->mtx);
}